

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O0

optional<std::vector<int,_std::allocator<int>_>_> * pbrt::SplitStringToInts(string_view str,char ch)

{
  string_view str_00;
  size_type sVar1;
  reference this;
  char *in_RSI;
  optional<std::vector<int,_std::allocator<int>_>_> *in_RDI;
  size_t i;
  vector<int,_std::allocator<int>_> ints;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  strs;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff28;
  undefined7 in_stack_ffffffffffffff30;
  undefined1 in_stack_ffffffffffffff37;
  optional<std::vector<int,_std::allocator<int>_>_> *__n;
  vector<int,_std::allocator<int>_> *this_00;
  ulong local_80;
  int *in_stack_ffffffffffffff88;
  string_view in_stack_ffffffffffffff90;
  char in_stack_ffffffffffffffaf;
  pointer in_stack_ffffffffffffffb0;
  vector<int,_std::allocator<int>_> local_38 [2];
  
  this_00 = local_38;
  str_00._M_str = in_RSI;
  str_00._M_len = (size_t)in_stack_ffffffffffffffb0;
  __n = in_RDI;
  SplitString_abi_cxx11_(str_00,in_stack_ffffffffffffffaf);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)this_00);
  std::allocator<int>::allocator((allocator<int> *)0x57c59f);
  std::vector<int,_std::allocator<int>_>::vector(this_00,(size_type)__n,(allocator_type *)in_RDI);
  std::allocator<int>::~allocator((allocator<int> *)0x57c5bf);
  local_80 = 0;
  do {
    sVar1 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_38);
    if (sVar1 <= local_80) {
      pstd::optional<std::vector<int,_std::allocator<int>_>_>::optional
                ((optional<std::vector<int,_std::allocator<int>_>_> *)
                 CONCAT17(in_stack_ffffffffffffff37,in_stack_ffffffffffffff30),
                 in_stack_ffffffffffffff28);
LAB_0057c6cc:
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)in_RDI);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)in_RDI);
      return __n;
    }
    this = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_38,local_80);
    std::__cxx11::string::operator_cast_to_basic_string_view((string *)this);
    std::vector<int,_std::allocator<int>_>::operator[]
              ((vector<int,_std::allocator<int>_> *)&stack0xffffffffffffffa0,local_80);
    in_stack_ffffffffffffff37 = Atoi(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (!(bool)in_stack_ffffffffffffff37) {
      memset(in_RDI,0,0x20);
      pstd::optional<std::vector<int,_std::allocator<int>_>_>::optional(in_RDI);
      goto LAB_0057c6cc;
    }
    local_80 = local_80 + 1;
  } while( true );
}

Assistant:

pstd::optional<std::vector<int>> SplitStringToInts(std::string_view str, char ch) {
    std::vector<std::string> strs = SplitString(str, ch);
    std::vector<int> ints(strs.size());

    for (size_t i = 0; i < strs.size(); ++i)
        if (!Atoi(strs[i], &ints[i]))
            return {};
    return ints;
}